

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::PlaTask::checkArguments
          (PlaTask *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type *pTVar3;
  Type *pTVar4;
  ConstantRange CVar5;
  Type *pTVar6;
  Expression *pEVar7;
  ulong uVar8;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount((SystemSubroutine *)this,context,false,args,range,3,3);
  if (bVar2) {
    if ((args->_M_extent)._M_extent_value != 0) {
      uVar8 = 0;
      do {
        pTVar6 = (args->_M_ptr[uVar8]->type).ptr;
        if (uVar8 == 0) {
          bVar2 = Type::isUnpackedArray(pTVar6);
          if (bVar2) {
            pTVar3 = Type::getArrayElementType(pTVar6);
            bVar2 = Type::isSimpleBitVector(pTVar3);
            if (bVar2) {
              pTVar4 = pTVar3->canonical;
              if (pTVar4 == (Type *)0x0) {
                Type::resolveCanonical(pTVar3);
                pTVar4 = pTVar3->canonical;
              }
              if ((pTVar4->super_Symbol).kind != PredefinedIntegerType) {
                bVar2 = Type::hasFixedRange(pTVar3);
                if (((bVar2) && ((*args->_M_ptr)->kind != Concatenation)) &&
                   (CVar5 = Type::getFixedRange(pTVar3), CVar5.right < CVar5.left)) {
                  pEVar7 = *args->_M_ptr;
                  goto LAB_008b9d5e;
                }
                goto LAB_008b9ccb;
              }
            }
          }
          pEVar7 = *args->_M_ptr;
          goto LAB_008b9d36;
        }
        bVar2 = Type::isSimpleBitVector(pTVar6);
        if (!bVar2) {
LAB_008b9d27:
          pEVar7 = args->_M_ptr[uVar8];
LAB_008b9d36:
          pTVar6 = SystemSubroutine::badArg((SystemSubroutine *)this,context,pEVar7);
          return pTVar6;
        }
        pTVar3 = pTVar6->canonical;
        if (pTVar3 == (Type *)0x0) {
          Type::resolveCanonical(pTVar6);
          pTVar3 = pTVar6->canonical;
        }
        if ((pTVar3->super_Symbol).kind == PredefinedIntegerType) goto LAB_008b9d27;
LAB_008b9ccb:
        bVar2 = Type::hasFixedRange(pTVar6);
        if (((bVar2) && (args->_M_ptr[uVar8]->kind != Concatenation)) &&
           (CVar5 = Type::getFixedRange(pTVar6), CVar5.right < CVar5.left)) {
          pEVar7 = args->_M_ptr[uVar8];
LAB_008b9d5e:
          pTVar6 = badRange(context,pEVar7);
          return pTVar6;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < (args->_M_extent)._M_extent_value);
    }
    pTVar6 = pCVar1->voidType;
  }
  else {
    pTVar6 = pCVar1->errorType;
  }
  return pTVar6;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();

        if (!checkArgCount(context, false, args, range, 3, 3))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            auto& type = *args[i]->type;

            if (i == 0) {
                if (!type.isUnpackedArray()) {
                    return badArg(context, *args[i]);
                }

                auto& elemType = *type.getArrayElementType();
                if (!elemType.isSimpleBitVector() || elemType.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }

                if (elemType.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                    !isValidRange(elemType)) {
                    return badRange(context, *args[i]);
                }
            }
            else {
                if (!type.isSimpleBitVector() || type.isPredefinedInteger()) {
                    return badArg(context, *args[i]);
                }
            }

            if (type.hasFixedRange() && args[i]->kind != ExpressionKind::Concatenation &&
                !isValidRange(type)) {
                return badRange(context, *args[i]);
            }
        }

        return comp.getVoidType();
    }